

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

bool __thiscall
HSimplexNla::sparseLoopStyle(HSimplexNla *this,HighsInt count,HighsInt dim,HighsInt *to_entry)

{
  bool bVar1;
  
  bVar1 = (double)count < (double)dim * 0.4;
  if (bVar1 && -1 < count) {
    dim = count;
  }
  *to_entry = dim;
  return bVar1 && -1 < count;
}

Assistant:

bool HSimplexNla::sparseLoopStyle(const HighsInt count, const HighsInt dim,
                                  HighsInt& to_entry) const {
  // Parameter to decide whether to use just the values in a HVector, or
  // use the indices of their nonzeros
  const bool use_indices = count >= 0 && count < kDensityForIndexing * dim;
  if (use_indices) {
    to_entry = count;
  } else {
    to_entry = dim;
  }
  return use_indices;
}